

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O1

void __thiscall
dg::vr::ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>
          (ValueRelations *this,Bucket *lt,Type rel,Value **rt)

{
  bool bVar1;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar2;
  
  pVar2 = get(this,*rt);
  bVar1 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                    (&this->graph,lt,rel,pVar2.first._M_data._M_data,(Relations *)0x0);
  this->changed = (bool)(this->changed | bVar1);
  return;
}

Assistant:

void set(const X &lt, Relations::Type rel, const Y &rt) {
        auto ltHPair = get(lt);
        auto rtHPair = get(rt);
        if (rtHPair.second) {
            ltHPair = get(lt);
            assert(!ltHPair.second);
        }
        bool ch = graph.addRelation(ltHPair.first, rel, rtHPair.first);
        updateChanged(ch);
    }